

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O2

int poptReadFile(char *fn,char **bp,size_t *nbp,int flags)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__nbytes;
  __off_t _Var4;
  char *__buf;
  char *pcVar5;
  int *piVar6;
  char *pcVar7;
  
  __buf = (char *)0x0;
  iVar3 = open(fn,0);
  if (-1 < iVar3) {
    __buf = (char *)0x0;
    __nbytes = (char *)lseek(iVar3,0,2);
    if (__nbytes != (char *)0xffffffffffffffff) {
      __buf = (char *)0x0;
      _Var4 = lseek(iVar3,0,0);
      if (_Var4 != -1) {
        __buf = (char *)calloc(1,(size_t)(__nbytes + 1));
        if (__buf == (char *)0x0) {
          __buf = (char *)0x0;
        }
        else {
          pcVar5 = (char *)read(iVar3,__buf,(size_t)__nbytes);
          if (pcVar5 == __nbytes) {
            iVar3 = close(iVar3);
            if (iVar3 != -1) {
              iVar3 = 0;
              if ((flags & 1U) != 0) {
                pcVar5 = __buf;
                for (pcVar7 = __buf;
                    (cVar1 = *pcVar7, cVar1 != '\0' && (pcVar7 < __buf + (long)__nbytes));
                    pcVar7 = pcVar7 + 1) {
                  if ((cVar1 == '\\') && (pcVar7[1] == '\n')) {
                    pcVar7 = pcVar7 + 1;
                  }
                  else {
                    *pcVar5 = cVar1;
                    pcVar5 = pcVar5 + 1;
                  }
                }
                *pcVar5 = '\0';
                __nbytes = pcVar5 + (1 - (long)__buf);
                iVar3 = 0;
              }
              goto LAB_001050f2;
            }
            goto LAB_001050e1;
          }
        }
      }
    }
    piVar6 = __errno_location();
    iVar2 = *piVar6;
    close(iVar3);
    *piVar6 = iVar2;
  }
LAB_001050e1:
  free(__buf);
  iVar3 = -0x10;
  __nbytes = (char *)0x0;
  __buf = (char *)0x0;
LAB_001050f2:
  if (bp == (char **)0x0) {
    free(__buf);
  }
  else {
    *bp = __buf;
  }
  if (nbp != (size_t *)0x0) {
    *nbp = (size_t)__nbytes;
  }
  return iVar3;
}

Assistant:

int poptReadFile(const char * fn, char ** bp, size_t * nbp, int flags)
{
    int fdno;
    char * b = NULL;
    off_t nb = 0;
    char * s, * t, * se;
    int rc = POPT_ERROR_ERRNO;	/* assume failure */

    fdno = open(fn, O_RDONLY);
    if (fdno < 0)
	goto exit;

    if ((nb = lseek(fdno, 0, SEEK_END)) == (off_t)-1
     || (uintmax_t)nb >= SIZE_MAX
     || lseek(fdno, 0, SEEK_SET) == (off_t)-1
     || (b = calloc(sizeof(*b), (size_t)nb + 1)) == NULL
     || read(fdno, (char *)b, (size_t)nb) != (ssize_t)nb)
    {
	int oerrno = errno;
	(void) close(fdno);
	if (nb != (off_t)-1 && (uintmax_t)nb >= SIZE_MAX)
	    errno = -EOVERFLOW;
	else
	    errno = oerrno;
	goto exit;
    }
    if (close(fdno) == -1)
	goto exit;
    if (b == NULL) {
	rc = POPT_ERROR_MALLOC;
	goto exit;
    }
    rc = 0;

   /* Trim out escaped newlines. */
    if (flags & POPT_READFILE_TRIMNEWLINES)
    {
	for (t = b, s = b, se = b + nb; *s && s < se; s++) {
	    switch (*s) {
	    case '\\':
		if (s[1] == '\n') {
		    s++;
		    continue;
		}
		/* fallthrough */
	    default:
		*t++ = *s;
		break;
	    }
	}
	*t++ = '\0';
	nb = (off_t)(t - b);
    }

exit:
    if (rc != 0) {
	if (b)
	    free(b);
	b = NULL;
	nb = 0;
    }
    if (bp)
	*bp = b;
    else if (b)
	free(b);
    if (nbp)
	*nbp = (size_t)nb;
    return rc;
}